

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.cpp
# Opt level: O3

void __thiscall iu_AssertionTest_x_iutest_x_NE_Test::Body(iu_AssertionTest_x_iutest_x_NE_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int *piVar2;
  AssertionResult iutest_ar;
  int *one;
  void **in_stack_fffffffffffffdc8;
  allocator<char> local_229;
  AssertionResult local_228;
  AssertionHelper local_200;
  int *local_1d0;
  undefined1 local_1c8 [432];
  
  local_1d0 = (int *)0x1;
  iutest::internal::backward::NeHelper<true>::Compare<int>
            (&local_228,"__null","one",(Object *)0x0,(int *)0x1);
  if (local_228.m_result == false) {
    memset((iu_global_format_stringstream *)local_1c8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,local_228.m_message._M_dataplus._M_p,&local_229);
    local_200.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
    ;
    local_200.m_part_result.super_iuCodeMessage.m_line = 0x86;
    local_200.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_200,(Fixed *)local_1c8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_200.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_200.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_200.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1c8);
    std::ios_base::~ios_base((ios_base *)(local_1c8 + 0x80));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228.m_message._M_dataplus._M_p == &local_228.m_message.field_2) {
      return;
    }
    goto LAB_0021c2e4;
  }
  paVar1 = &local_228.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_228.m_message._M_dataplus._M_p,
                    CONCAT71(local_228.m_message.field_2._M_allocated_capacity._1_7_,
                             local_228.m_message.field_2._M_local_buf[0]) + 1);
  }
  piVar2 = local_1d0;
  iutest::internal::backward::NeHelper<true>::Compare<int>
            (&local_228,"nullptr","one",(Object *)0x0,local_1d0);
  if (local_228.m_result == false) {
    memset((iu_global_format_stringstream *)local_1c8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,local_228.m_message._M_dataplus._M_p,&local_229);
    local_200.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
    ;
    local_200.m_part_result.super_iuCodeMessage.m_line = 0x89;
    local_200.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_200,(Fixed *)local_1c8,false);
LAB_0021c2a1:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_200.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_200.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_200.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1c8);
    std::ios_base::~ios_base((ios_base *)(local_1c8 + 0x80));
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_228.m_message._M_dataplus._M_p,
                      CONCAT71(local_228.m_message.field_2._M_allocated_capacity._1_7_,
                               local_228.m_message.field_2._M_local_buf[0]) + 1);
    }
    local_1c8._0_8_ = (int *)0x0;
    if (piVar2 == (int *)0x0) {
      iutest::internal::CmpHelperOpFailure<int*,decltype(nullptr)>
                (&local_228,(internal *)"one","nullptr","!=",(char *)&local_1d0,(int **)local_1c8,
                 in_stack_fffffffffffffdc8);
      if ((local_228.m_result & 1U) == 0) {
        memset((iu_global_format_stringstream *)local_1c8,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_1c8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_200,local_228.m_message._M_dataplus._M_p,&local_229);
        local_200.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
        ;
        local_200.m_part_result.super_iuCodeMessage.m_line = 0x8a;
        local_200.m_part_result.super_iuCodeMessage._44_4_ = 2;
        iutest::AssertionHelper::OnFixed(&local_200,(Fixed *)local_1c8,false);
        goto LAB_0021c2a1;
      }
    }
    else {
      local_228.m_message._M_string_length = 0;
      local_228.m_message.field_2._M_local_buf[0] = '\0';
      local_228.m_result = true;
      local_228.m_message._M_dataplus._M_p = (pointer)paVar1;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.m_message._M_dataplus._M_p == paVar1) {
    return;
  }
LAB_0021c2e4:
  operator_delete(local_228.m_message._M_dataplus._M_p,
                  CONCAT71(local_228.m_message.field_2._M_allocated_capacity._1_7_,
                           local_228.m_message.field_2._M_local_buf[0]) + 1);
  return;
}

Assistant:

IUTEST(AssertionTest, NE)
{
    int x0=0, x1=1;
    IUTEST_ASSERT_NE(x0, x1);
    IUTEST_EXPECT_NE(x0, x1);
    IUTEST_INFORM_NE(x0, x1);
    int* one=reinterpret_cast<int*>(1);
    IUTEST_ASSERT_NE(NULL, one);

#if IUTEST_HAS_NULLPTR
    IUTEST_ASSERT_NE(nullptr, one);
    IUTEST_ASSERT_NE(one, nullptr);
#endif
}